

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.cpp
# Opt level: O0

void __thiscall
Move::Move(Move *this,Position *initialPosition,Position *lastPosition,NurseSolution *movedNurse,
          NurseSolution *tradedNurse)

{
  NurseSolution *tradedNurse_local;
  NurseSolution *movedNurse_local;
  Position *lastPosition_local;
  Position *initialPosition_local;
  Move *this_local;
  
  Position::Position(&this->initialPosition,initialPosition);
  Position::Position(&this->lastPosition,lastPosition);
  this->movedNurse = movedNurse;
  this->tradedNurse = tradedNurse;
  return;
}

Assistant:

Move::Move(Position initialPosition,Position lastPosition, NurseSolution* movedNurse, NurseSolution* tradedNurse) : initialPosition(initialPosition), lastPosition(lastPosition), movedNurse(movedNurse) , tradedNurse(tradedNurse){}